

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupJUnitOutputTest::~TEST_GROUP_CppUTestGroupJUnitOutputTest
          (TEST_GROUP_CppUTestGroupJUnitOutputTest *this)

{
  TEST_GROUP_CppUTestGroupJUnitOutputTest *this_local;
  
  ~TEST_GROUP_CppUTestGroupJUnitOutputTest(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_GROUP(JUnitOutputTest)
{
    JUnitTestOutput *junitOutput;
    TestResult *result;
    JUnitTestOutputTestRunner *testCaseRunner;
    FileForJUnitOutputTests* outputFile;

    void setup() _override
    {
        UT_PTR_SET(PlatformSpecificFOpen, mockFOpen);
        UT_PTR_SET(PlatformSpecificFPuts, mockFPuts);
        UT_PTR_SET(PlatformSpecificFClose, mockFClose);
        junitOutput = new JUnitTestOutput();
        result = new TestResult(*junitOutput);
        testCaseRunner = new JUnitTestOutputTestRunner(*result);
    }

    void teardown() _override
    {
        delete testCaseRunner;
        delete result;
        delete junitOutput;
        fileSystem.clear();
    }
}